

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

int flipConePdr(Aig_Man_t *pAig,int directive,int targetCSPropertyIndex,int safetyInvariantPOIndex,
               int absorberCount)

{
  byte *pbVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  char *__s;
  Aig_Man_t *p;
  ulong uVar7;
  Pdr_Par_t *pPars;
  ulong uVar8;
  Pdr_Par_t Pars;
  Pdr_Par_t PStack_b8;
  
  __s = (char *)malloc(0x32);
  sprintf(__s,"%s_%d.%s","kLive",(ulong)(uint)absorberCount,"blif");
  if (((uint)directive < 5) && ((0x1aU >> (directive & 0x1fU) & 1) != 0)) {
    if (safetyInvariantPOIndex == -1) {
      __assert_fail("safetyInvariantPOIndex != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x164,"int flipConePdr(Aig_Man_t *, int, int, int, int)");
    }
    modifyAigToApplySafetyInvar(pAig,targetCSPropertyIndex,safetyInvariantPOIndex);
  }
  p = Aig_ManDupSimple(pAig);
  iVar6 = p->nTruePos;
  if (0 < (long)iVar6) {
    pVVar3 = p->vCos;
    uVar2 = pVVar3->nSize;
    uVar8 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar8;
    }
    do {
      if (uVar7 == uVar8) goto LAB_00592d76;
      pvVar4 = pVVar3->pArray[uVar8];
      if (((ulong)pvVar4 & 1) != 0) goto LAB_00592d95;
      pbVar1 = (byte *)((long)pvVar4 + 8);
      *pbVar1 = *pbVar1 ^ 1;
      uVar8 = uVar8 + 1;
    } while ((long)iVar6 != uVar8);
  }
  Pdr_ManSetDefaultParams(&PStack_b8);
  PStack_b8.fVerbose = 1;
  PStack_b8.fNotVerbose = 1;
  PStack_b8.fSolveAll = 1;
  p->vSeqModelVec = (Vec_Ptr_t *)0x0;
  Aig_ManCleanup(p);
  iVar6 = Aig_ManCheck(p);
  if (iVar6 == 0) {
    __assert_fail("Aig_ManCheck( pAig )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                  ,0x178,"int flipConePdr(Aig_Man_t *, int, int, int, int)");
  }
  Pdr_ManSolve(p,&PStack_b8);
  pVVar3 = p->vSeqModelVec;
  if (pVVar3 == (Vec_Ptr_t *)0x0) {
    exit(0);
  }
  if ((-1 < targetCSPropertyIndex) && (targetCSPropertyIndex < pVVar3->nSize)) {
    pvVar4 = pVVar3->pArray[(uint)targetCSPropertyIndex];
    free(__s);
    iVar6 = p->nTruePos;
    if (0 < (long)iVar6) {
      pVVar3 = p->vCos;
      uVar2 = pVVar3->nSize;
      uVar8 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar8;
      }
      do {
        if (uVar7 == uVar8) goto LAB_00592d76;
        pvVar5 = pVVar3->pArray[uVar8];
        if (((ulong)pvVar5 & 1) != 0) {
LAB_00592d95:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x13c,"void Aig_ObjChild0Flip(Aig_Obj_t *)");
        }
        pbVar1 = (byte *)((long)pvVar5 + 8);
        *pbVar1 = *pbVar1 ^ 1;
        uVar8 = uVar8 + 1;
      } while ((long)iVar6 != uVar8);
    }
    Aig_ManStop(p);
    return (uint)(pvVar4 == (void *)0x0);
  }
LAB_00592d76:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int flipConePdr( Aig_Man_t *pAig, int directive, int targetCSPropertyIndex, int safetyInvariantPOIndex, int absorberCount )
{
	int RetValue, i;
	Aig_Obj_t *pObjTargetPo;
	Aig_Man_t *pAigDupl;
	Pdr_Par_t Pars, * pPars = &Pars;
	Abc_Cex_t * pCex = NULL;

	char *fileName;
	
	fileName = (char *)malloc(sizeof(char) * 50);
	sprintf(fileName, "%s_%d.%s", "kLive", absorberCount, "blif" );

	if( directive == kCS_WITH_SAFETY_INVARIANTS || directive == kCS_WITH_SAFETY_AND_DCS_INVARIANTS || directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS )
	{
		assert( safetyInvariantPOIndex != -1 );
		modifyAigToApplySafetyInvar(pAig, targetCSPropertyIndex, safetyInvariantPOIndex);
	}

	pAigDupl = pAig;
	pAig = Aig_ManDupSimple( pAigDupl );

	for( i=0; i<Saig_ManPoNum(pAig); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAig, i );
		Aig_ObjChild0Flip( pObjTargetPo );
	}

	Pdr_ManSetDefaultParams( pPars );
	pPars->fVerbose = 1;
	pPars->fNotVerbose = 1;
	pPars->fSolveAll = 1;
	pAig->vSeqModelVec = NULL;

	Aig_ManCleanup( pAig );
	assert( Aig_ManCheck( pAig ) );

	Pdr_ManSolve( pAig, pPars );	

	if( pAig->vSeqModelVec )
	{
		pCex = (Abc_Cex_t *)Vec_PtrEntry( pAig->vSeqModelVec, targetCSPropertyIndex );
		if( pCex == NULL )
		{
			RetValue = 1;
		}
		else
			RetValue = 0;
	}
	else
	{
		RetValue = -1;
		exit(0);
	}

	free(fileName);

	for( i=0; i<Saig_ManPoNum(pAig); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAig, i );
		Aig_ObjChild0Flip( pObjTargetPo );
	}
	
	Aig_ManStop( pAig );
	return RetValue;
}